

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O1

Expectation __thiscall
testing::internal::UntypedFunctionMockerBase::GetHandleOf
          (UntypedFunctionMockerBase *this,ExpectationBase *exp)

{
  ExpectationBase *pEVar1;
  FailureReporterInterface *pFVar2;
  ExpectationBase *in_RDX;
  linked_ptr_internal *extraout_RDX;
  linked_ptr_internal *extraout_RDX_00;
  linked_ptr_internal *extraout_RDX_01;
  linked_ptr_internal lVar3;
  linked_ptr<testing::internal::ExpectationBase> *ptr;
  bool bVar4;
  Expectation EVar5;
  long *local_38 [2];
  long local_28 [2];
  
  ptr = *(linked_ptr<testing::internal::ExpectationBase> **)((long)&(exp->source_text_).field_2 + 8)
  ;
  bVar4 = ptr == *(linked_ptr<testing::internal::ExpectationBase> **)&exp->cardinality_specified_;
  if (!bVar4) {
    pEVar1 = ptr->value_;
    while (pEVar1 != in_RDX) {
      ptr = ptr + 1;
      bVar4 = ptr == *(linked_ptr<testing::internal::ExpectationBase> **)
                      &exp->cardinality_specified_;
      if (bVar4) goto LAB_0012cf8d;
      pEVar1 = ptr->value_;
    }
    linked_ptr<testing::internal::ExpectationBase>::linked_ptr
              ((linked_ptr<testing::internal::ExpectationBase> *)this,ptr);
    lVar3.next_ = extraout_RDX;
    if (!bVar4) goto LAB_0012cff4;
  }
LAB_0012cf8d:
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"Cannot find expectation.","");
  pFVar2 = GetFailureReporter();
  (*pFVar2->_vptr_FailureReporterInterface[2])
            (pFVar2,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jmossberg[P]tenniskatacpp/google/googlemock/src/gmock-spec-builders.cc"
             ,0x1ca,local_38);
  lVar3.next_ = extraout_RDX_00;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
    lVar3.next_ = extraout_RDX_01;
  }
  this->_vptr_UntypedFunctionMockerBase = (_func_int **)0x0;
  this->mock_obj_ = &this->mock_obj_;
LAB_0012cff4:
  EVar5.expectation_base_.link_.next_ = lVar3.next_;
  EVar5.expectation_base_.value_ = (ExpectationBase *)this;
  return (Expectation)EVar5.expectation_base_;
}

Assistant:

Expectation UntypedFunctionMockerBase::GetHandleOf(ExpectationBase* exp) {
  for (UntypedExpectations::const_iterator it =
           untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    if (it->get() == exp) {
      return Expectation(*it);
    }
  }

  Assert(false, __FILE__, __LINE__, "Cannot find expectation.");
  return Expectation();
  // The above statement is just to make the code compile, and will
  // never be executed.
}